

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

void evmap_delete_all_(event_base *base)

{
  event_base *base_local;
  
  evmap_signal_foreach_signal(base,evmap_signal_delete_all_iter_fn,(void *)0x0);
  evmap_io_foreach_fd(base,evmap_io_delete_all_iter_fn,(void *)0x0);
  return;
}

Assistant:

void
evmap_delete_all_(struct event_base *base)
{
	evmap_signal_foreach_signal(base, evmap_signal_delete_all_iter_fn, NULL);
	evmap_io_foreach_fd(base, evmap_io_delete_all_iter_fn, NULL);
}